

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::extractLaneUI16x8(Literal *__return_storage_ptr__,Literal *this,uint8_t index)

{
  reference other;
  LaneArray<8> local_e0;
  byte local_19;
  Literal *pLStack_18;
  uint8_t index_local;
  Literal *this_local;
  
  local_19 = index;
  pLStack_18 = this;
  this_local = __return_storage_ptr__;
  getLanesUI16x8(&local_e0,this);
  other = std::array<wasm::Literal,_8UL>::at(&local_e0,(ulong)local_19);
  Literal(__return_storage_ptr__,other);
  std::array<wasm::Literal,_8UL>::~array(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extractLaneUI16x8(uint8_t index) const {
  return getLanesUI16x8().at(index);
}